

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdgif.c
# Opt level: O0

int LZWReadByte(gif_source_ptr sinfo)

{
  UINT8 UVar1;
  int iVar2;
  UINT8 *pUVar3;
  gif_source_ptr in_RDI;
  int incode;
  int code;
  gif_source_ptr in_stack_000000e0;
  uint local_18;
  uint local_14;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RDI->symbol_stack < in_RDI->sp) {
    pUVar3 = in_RDI->sp;
    in_RDI->sp = pUVar3 + -1;
    local_14 = (uint)pUVar3[-1];
  }
  else {
    local_18 = GetCode((gif_source_ptr)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                      );
    if (local_18 == in_RDI->clear_code) {
      ReInitLZW(in_RDI);
      do {
        local_14 = GetCode((gif_source_ptr)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      } while (local_14 == in_RDI->clear_code);
      if (in_RDI->clear_code < (int)local_14) {
        in_RDI->cinfo->err->msg_code = 0x400;
        (*in_RDI->cinfo->err->emit_message)((j_common_ptr)in_RDI->cinfo,-1);
        local_14 = 0;
      }
      in_RDI->oldcode = local_14;
      in_RDI->firstcode = local_14;
    }
    else if (local_18 == in_RDI->end_code) {
      if (in_RDI->out_of_blocks == 0) {
        SkipDataBlocks(in_stack_000000e0);
        in_RDI->out_of_blocks = 1;
      }
      in_RDI->cinfo->err->msg_code = 0x402;
      (*in_RDI->cinfo->err->emit_message)((j_common_ptr)in_RDI->cinfo,-1);
      local_14 = 0;
    }
    else {
      local_14 = local_18;
      if (in_RDI->max_code <= (int)local_18) {
        if (in_RDI->max_code < (int)local_18) {
          in_RDI->cinfo->err->msg_code = 0x400;
          (*in_RDI->cinfo->err->emit_message)((j_common_ptr)in_RDI->cinfo,-1);
          local_18 = 0;
        }
        pUVar3 = in_RDI->sp;
        in_RDI->sp = pUVar3 + 1;
        *pUVar3 = (UINT8)in_RDI->firstcode;
        local_14 = in_RDI->oldcode;
      }
      for (; in_RDI->clear_code <= (int)local_14;
          local_14 = (uint)in_RDI->symbol_head[(int)local_14]) {
        UVar1 = in_RDI->symbol_tail[(int)local_14];
        pUVar3 = in_RDI->sp;
        in_RDI->sp = pUVar3 + 1;
        *pUVar3 = UVar1;
      }
      in_RDI->firstcode = local_14;
      iVar2 = in_RDI->max_code;
      if (iVar2 < 0x1000) {
        in_RDI->symbol_head[iVar2] = (UINT16)in_RDI->oldcode;
        in_RDI->symbol_tail[iVar2] = (UINT8)in_RDI->firstcode;
        in_RDI->max_code = in_RDI->max_code + 1;
        if ((in_RDI->limit_code <= in_RDI->max_code) && (in_RDI->code_size < 0xc)) {
          in_RDI->code_size = in_RDI->code_size + 1;
          in_RDI->limit_code = in_RDI->limit_code << 1;
        }
      }
      in_RDI->oldcode = local_18;
      local_14 = in_RDI->firstcode;
    }
  }
  return local_14;
}

Assistant:

LOCAL(int)
LZWReadByte(gif_source_ptr sinfo)
/* Read an LZW-compressed byte */
{
  register int code;            /* current working code */
  int incode;                   /* saves actual input code */

  /* If any codes are stacked from a previously read symbol, return them */
  if (sinfo->sp > sinfo->symbol_stack)
    return (int)(*(--sinfo->sp));

  /* Time to read a new symbol */
  code = GetCode(sinfo);

  if (code == sinfo->clear_code) {
    /* Reinit state, swallow any extra Clear codes, and */
    /* return next code, which is expected to be a raw byte. */
    ReInitLZW(sinfo);
    do {
      code = GetCode(sinfo);
    } while (code == sinfo->clear_code);
    if (code > sinfo->clear_code) { /* make sure it is a raw byte */
      WARNMS(sinfo->cinfo, JWRN_GIF_BADDATA);
      code = 0;                 /* use something valid */
    }
    /* make firstcode, oldcode valid! */
    sinfo->firstcode = sinfo->oldcode = code;
    return code;
  }

  if (code == sinfo->end_code) {
    /* Skip the rest of the image, unless GetCode already read terminator */
    if (!sinfo->out_of_blocks) {
      SkipDataBlocks(sinfo);
      sinfo->out_of_blocks = TRUE;
    }
    /* Complain that there's not enough data */
    WARNMS(sinfo->cinfo, JWRN_GIF_ENDCODE);
    /* Pad data with 0's */
    return 0;                   /* fake something usable */
  }

  /* Got normal raw byte or LZW symbol */
  incode = code;                /* save for a moment */

  if (code >= sinfo->max_code) { /* special case for not-yet-defined symbol */
    /* code == max_code is OK; anything bigger is bad data */
    if (code > sinfo->max_code) {
      WARNMS(sinfo->cinfo, JWRN_GIF_BADDATA);
      incode = 0;               /* prevent creation of loops in symbol table */
    }
    /* this symbol will be defined as oldcode/firstcode */
    *(sinfo->sp++) = (UINT8)sinfo->firstcode;
    code = sinfo->oldcode;
  }

  /* If it's a symbol, expand it into the stack */
  while (code >= sinfo->clear_code) {
    *(sinfo->sp++) = sinfo->symbol_tail[code]; /* tail is a byte value */
    code = sinfo->symbol_head[code]; /* head is another LZW symbol */
  }
  /* At this point code just represents a raw byte */
  sinfo->firstcode = code;      /* save for possible future use */

  /* If there's room in table... */
  if ((code = sinfo->max_code) < LZW_TABLE_SIZE) {
    /* Define a new symbol = prev sym + head of this sym's expansion */
    sinfo->symbol_head[code] = (UINT16)sinfo->oldcode;
    sinfo->symbol_tail[code] = (UINT8)sinfo->firstcode;
    sinfo->max_code++;
    /* Is it time to increase code_size? */
    if (sinfo->max_code >= sinfo->limit_code &&
        sinfo->code_size < MAX_LZW_BITS) {
      sinfo->code_size++;
      sinfo->limit_code <<= 1;  /* keep equal to 2^code_size */
    }
  }

  sinfo->oldcode = incode;      /* save last input symbol for future use */
  return sinfo->firstcode;      /* return first byte of symbol's expansion */
}